

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O2

Board * create_Board(Board *board,int row,int col)

{
  Ship *ship;
  pointer pSVar1;
  Ship ship_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined3 uVar5;
  undefined4 uVar6;
  bool bVar7;
  int row_00;
  int col_00;
  Ship *pSVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  undefined8 in_stack_ffffffffffffffa0;
  
  iVar11 = 0;
LAB_00102cc5:
  if ((ulong)(((long)(board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18) <= (ulong)(long)iVar11) {
    return board;
  }
  iVar10 = 0;
  pSVar8 = (Ship *)CONCAT71((int7)(int3)((uint)iVar11 >> 8),1);
LAB_00102ce5:
  do {
    do {
      lVar9 = (long)iVar11 * 0x18;
      while( true ) {
        if (((ulong)pSVar8 & 1) == 0) {
          iVar11 = iVar11 + 1;
          goto LAB_00102cc5;
        }
        if (iVar10 != board->column * board->row) break;
        iVar11 = iVar11 + -2;
        lVar9 = lVar9 + -0x30;
        pSVar8 = (Ship *)0x0;
      }
      iVar10 = iVar10 + 1;
      row_00 = generate_random_number(row);
      col_00 = generate_random_number(col);
      bVar7 = validation(board,row_00,col_00,pSVar8);
      pSVar8 = (Ship *)CONCAT71((int7)((ulong)pSVar8 >> 8),1);
    } while (!bVar7);
    pSVar8 = (Ship *)(&((board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                        super__Vector_impl_data._M_start)->ID + lVar9);
    val_Orientation(board,row_00,col_00,pSVar8);
    pSVar1 = (board->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar8 = (Ship *)CONCAT71((int7)((ulong)pSVar8 >> 8),1);
  } while ((&pSVar1->orientation)[lVar9] == 'D');
  ship = (Ship *)(&pSVar1->ID + lVar9);
  if (*(int *)((long)&pSVar1->length + lVar9) != 1) goto LAB_00102d91;
  (&pSVar1->ID)[lVar9] = 'S';
  *(int *)((long)&pSVar1->sRow + lVar9) = row_00;
  *(int *)((long)&pSVar1->sCol + lVar9) = col_00;
  (&pSVar1->orientation)[lVar9] = 'U';
  *(undefined4 *)((long)&pSVar1->direction + lVar9) = 0;
  Board::set_position_submarine(board,ship);
  goto LAB_00102dd3;
LAB_00102d91:
  uVar2 = ship->sRow;
  uVar3 = ship->sCol;
  uVar4 = ship->orientation;
  uVar5 = *(undefined3 *)&ship->field_0x11;
  uVar6 = ship->direction;
  ship_00.sCol = uVar6;
  ship_00.sRow._1_3_ = uVar5;
  ship_00.sRow._0_1_ = uVar4;
  ship_00.length = uVar3;
  ship_00._0_4_ = uVar2;
  ship_00.orientation = (char)in_stack_ffffffffffffffa0;
  ship_00._17_3_ = (int3)((ulong)in_stack_ffffffffffffffa0 >> 8);
  ship_00.direction = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  bVar7 = val_positioning(board,row_00,col_00,ship_00);
  pSVar8 = (Ship *)CONCAT71((int7)((ulong)pSVar8 >> 8),1);
  if (bVar7) {
    Board::set_position(board,(Ship *)(&((board->armada).
                                         super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                                         super__Vector_impl_data._M_start)->ID + lVar9));
LAB_00102dd3:
    pSVar8 = (Ship *)0x0;
  }
  goto LAB_00102ce5;
}

Assistant:

Board *create_Board( Board *board, int row, int col )
{
	  int x, y;//! iterators that'll have their value randomly chosen

    bool permission, control; //! controls the verification loop

    int count; //! control helper so that we can avoid infinite loops

    for( int vec = 0; vec < board->armada.size(); vec++ ) //! positioning each element of the armada from largest to smallest.
    {
        permission = false;
        count = 0;

        while( permission == false )
        {
            if( count == board->row * board->column )
            {
                permission = true;
                vec = vec - 2;
                continue;
            }
            count++;

           	//! controls the generate_random_number seed in order to avoid repetition
            x = generate_random_number( row );
            y = generate_random_number( col ); //! random value from each ship's start (x, y values from Ship class)

            //! first verification of the chosen coordinate
            control = validation( board, x, y, &board->armada[vec] );
            
			if( control == false )
            {;
                permission = false;
                continue;
            }

            //! identify the ship's orientation 
            val_Orientation( board, x, y, &board->armada[vec] );
            
			if( board->armada[vec].orientation == 'D')
            {
                permission = false;
                continue;
            }


            if( ( board->armada[vec].length == 1 ) and ( board->armada[vec].ID = 'S' ) ) //! the submarine needs only of one verification, after that it may be positioned
            {
                board->armada[vec].set_values( x, y, 'U', 0 );
                board->set_position_submarine( &board->armada[vec] );
                permission = true;
                continue;
            } 

            //! validates the positioning of the ship and its shadow
            control = val_positioning( board, x, y, board->armada[vec] );
            
			if( control == false )
            {
                permission = false;
                continue;
            }

            //! plots the ship after all verifications 
            board->set_position( &board->armada[vec] );
            permission = true;

        }

    } 
    return board;
}